

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

void __thiscall
QItemDelegate::drawCheck
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          CheckState state)

{
  bool bVar1;
  QFlags<QStyle::StateFlag> QVar2;
  QItemDelegatePrivate *this_00;
  QWidget *pQVar3;
  QStyleOptionViewItem *this_01;
  undefined8 *in_RCX;
  QStyleOptionViewItem *in_RDX;
  undefined8 in_RSI;
  int in_R8D;
  long in_FS_OFFSET;
  QStyle *style;
  QWidget *widget;
  QItemDelegatePrivate *d;
  QStyleOptionViewItem opt;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  QStyleOptionViewItem *in_stack_fffffffffffffec0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QItemDelegate *)0x8559ff);
  bVar1 = QRect::isValid((QRect *)in_stack_fffffffffffffec0);
  if (bVar1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionViewItem::QStyleOptionViewItem
              (in_stack_fffffffffffffec0,
               (QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
              );
    local_c8 = (undefined1 *)*in_RCX;
    puStack_c0 = (undefined1 *)in_RCX[1];
    QVar2 = QFlags<QStyle::StateFlag>::operator&
                      ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffec0,
                       in_stack_fffffffffffffebc);
    puStack_d0 = (undefined1 *)
                 CONCAT44(puStack_d0._4_4_,
                          QVar2.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                          super_QFlagsStorage<QStyle::StateFlag>.i);
    if (in_R8D == 0) {
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&puStack_d0,State_Off);
    }
    else if (in_R8D == 1) {
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&puStack_d0,State_NoChange)
      ;
    }
    else if (in_R8D == 2) {
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&puStack_d0,State_On);
    }
    pQVar3 = QItemDelegatePrivate::widget(this_00,in_RDX);
    if (pQVar3 == (QWidget *)0x0) {
      this_01 = (QStyleOptionViewItem *)QApplication::style();
    }
    else {
      this_01 = (QStyleOptionViewItem *)
                QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    (**(code **)(*(long *)&this_01->super_QStyleOption + 0xb0))
              (this_01,0x19,&local_d8,in_RSI,pQVar3);
    QStyleOptionViewItem::~QStyleOptionViewItem(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::drawCheck(QPainter *painter,
                              const QStyleOptionViewItem &option,
                              const QRect &rect, Qt::CheckState state) const
{
    Q_D(const QItemDelegate);
    if (!rect.isValid())
        return;

    QStyleOptionViewItem opt(option);
    opt.rect = rect;
    opt.state = opt.state & ~QStyle::State_HasFocus;

    switch (state) {
    case Qt::Unchecked:
        opt.state |= QStyle::State_Off;
        break;
    case Qt::PartiallyChecked:
        opt.state |= QStyle::State_NoChange;
        break;
    case Qt::Checked:
        opt.state |= QStyle::State_On;
        break;
    }

    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    style->drawPrimitive(QStyle::PE_IndicatorItemViewItemCheck, &opt, painter, widget);
}